

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

void __thiscall
GlobOpt::ToTypeSpec(GlobOpt *this,BVSparse<Memory::JitArenaAllocator> *bv,BasicBlock *block,
                   IRType toType,BailOutKind bailOutKind,bool lossy,Instr *insertBeforeInstr)

{
  int iVar1;
  long lVar2;
  code *pcVar3;
  BOOLEAN BVar4;
  bool bVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  StackSym *this_00;
  RegOpnd *opnd;
  IRType type;
  SymID id;
  BVUnitT<unsigned_long> local_40;
  SparseBVUnit _unit;
  
  _unit.word = (Type)bv;
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  do {
    _unit.word = *_unit.word;
    if (_unit.word == 0) {
      return;
    }
    iVar1 = *(int *)(_unit.word + 8);
    local_40.word = *(ulong *)(_unit.word + 0x10);
    while (local_40.word != 0) {
      lVar2 = 0;
      if (local_40.word != 0) {
        for (; (local_40.word >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
        }
      }
      id = iVar1 + (BVIndex)lVar2;
      BVUnitT<unsigned_long>::Clear(&local_40,(BVIndex)lVar2);
      this_00 = SymTable::FindStackSym(this->func->m_symTable,id);
      if ((block->globOptData).argObjSyms != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        BVar6 = GlobOptBlockData::IsArgumentsSymID(&block->globOptData,id);
        if (BVar6 != 0) {
          CannotAllocateArgumentsObjectOnStack(this,(Func *)0x0);
        }
      }
      BVar4 = BVSparse<Memory::JitArenaAllocator>::Test((block->globOptData).liveVarSyms,id);
      type = TyVar;
      if (BVar4 == '\0') {
        BVar4 = BVSparse<Memory::JitArenaAllocator>::Test((block->globOptData).liveInt32Syms,id);
        if (BVar4 != '\0') {
          BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                            ((block->globOptData).liveLossyInt32Syms,id);
          if (BVar4 == '\0') {
            this_00 = StackSym::GetInt32EquivSym(this_00,this->func);
            type = TyInt32;
            goto LAB_0041c7b3;
          }
        }
        BVar4 = BVSparse<Memory::JitArenaAllocator>::Test((block->globOptData).liveFloat64Syms,id);
        if (BVar4 == '\0') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x3a2,"((0))","UNREACHED");
          if (!bVar5) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar7 = 0;
          type = TyIllegal;
        }
        else {
          this_00 = StackSym::GetFloat64EquivSym(this_00,this->func);
          type = TyFloat64;
        }
      }
LAB_0041c7b3:
      opnd = IR::RegOpnd::New(this_00,type,this->func);
      ToTypeSpecUse(this,(Instr *)0x0,&opnd->super_Opnd,block,(Value *)0x0,(IndirOpnd *)0x0,toType,
                    bailOutKind,lossy,insertBeforeInstr);
    }
  } while( true );
}

Assistant:

void
GlobOpt::ToTypeSpec(BVSparse<JitArenaAllocator> *bv, BasicBlock *block, IRType toType, IR::BailOutKind bailOutKind, bool lossy, IR::Instr *insertBeforeInstr)
{
    FOREACH_BITSET_IN_SPARSEBV(id, bv)
    {
        StackSym *stackSym = this->func->m_symTable->FindStackSym(id);
        IRType fromType = TyIllegal;

        // Win8 bug: 757126. If we are trying to type specialize the arguments object,
        // let's make sure stack args optimization is not enabled. This is a problem, particularly,
        // if the instruction comes from an unreachable block. In other cases, the pass on the
        // instruction itself should disable arguments object optimization.
        if(block->globOptData.argObjSyms && block->globOptData.IsArgumentsSymID(id))
        {
            CannotAllocateArgumentsObjectOnStack(nullptr);
        }

        if (block->globOptData.liveVarSyms->Test(id))
        {
            fromType = TyVar;
        }
        else if (block->globOptData.liveInt32Syms->Test(id) && !block->globOptData.liveLossyInt32Syms->Test(id))
        {
            fromType = TyInt32;
            stackSym = stackSym->GetInt32EquivSym(this->func);
        }
        else if (block->globOptData.liveFloat64Syms->Test(id))
        {

            fromType = TyFloat64;
            stackSym = stackSym->GetFloat64EquivSym(this->func);
        }
        else
        {
            Assert(UNREACHED);
        }

        IR::RegOpnd *newOpnd = IR::RegOpnd::New(stackSym, fromType, this->func);

        this->ToTypeSpecUse(nullptr, newOpnd, block, nullptr, nullptr, toType, bailOutKind, lossy, insertBeforeInstr);
    } NEXT_BITSET_IN_SPARSEBV;
}